

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void read_input(Direction *direction_1,Direction *direction_2,bool *END_GAME)

{
  byte bVar1;
  char input_char3;
  char input_char2;
  char input_char1;
  termios t;
  char local_7b;
  char local_7a;
  byte local_79;
  Direction *local_78;
  termios local_6c;
  
  if (*END_GAME == false) {
    local_78 = direction_1;
    do {
      tcgetattr(0,&local_6c);
      local_6c.c_lflag._0_1_ = (byte)local_6c.c_lflag & 0xfd;
      tcsetattr(0,0,&local_6c);
      std::operator>>((istream *)&std::cin,(char *)&local_79);
      bVar1 = local_79;
      if ((local_79 - 0x61 < 0x17) && ((0x440009U >> (local_79 - 0x61 & 0x1f) & 1) != 0)) {
        change_direction_move(direction_2,local_79);
      }
      if (bVar1 == 0x1b) {
        std::operator>>((istream *)&std::cin,&local_7a);
        std::operator>>((istream *)&std::cin,&local_7b);
        if (local_7a == '[') {
          change_direction_move(local_78,local_7b);
        }
      }
    } while (*END_GAME != true);
  }
  return;
}

Assistant:

void read_input(Direction& direction_1, Direction& direction_2, bool& END_GAME)
{
    while(!END_GAME)
    {
        // Black magic to prevent Linux from buffering keystrokes.
        struct termios t;
        tcgetattr(STDIN_FILENO, &t);
        t.c_lflag &= ~ICANON;
        tcsetattr(STDIN_FILENO, TCSANOW, &t);

        char input_char1, input_char2, input_char3;
        cin >> input_char1;

        // PLAYER 2
        if(input_char1 == 'w' or input_char1 == 's' or input_char1 == 'd' or input_char1 == 'a')
            change_direction_move(direction_2, input_char1);

        // PLAYER 1
        if(input_char1 == 27)
        {
            cin >> input_char2;
            cin >> input_char3;
            if (input_char2 == 91)
                change_direction_move(direction_1, input_char3);
        }
    }
}